

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectDeclaration_Variable.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,VariableDeclarationSymbol *var)

{
  ostream *poVar1;
  Lexeme *this;
  Type *ty;
  string local_40;
  
  if (var != (VariableDeclarationSymbol *)0x0) {
    std::operator<<(os,"<Variable |");
    poVar1 = std::operator<<(os," name:");
    this = &ObjectDeclarationSymbol::name(&var->super_ObjectDeclarationSymbol)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<(os," type:");
    ty = ObjectDeclarationSymbol::type(&var->super_ObjectDeclarationSymbol);
    operator<<(poVar1,ty);
    std::operator<<(os,">");
    return os;
  }
  poVar1 = std::operator<<(os,"<Variable is null>");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const VariableDeclarationSymbol* var)
{
    if (!var)
        return os << "<Variable is null>";
    os << "<Variable |";
    os << " name:" << var->name()->valueText();
    os << " type:" << var->type();
    os << ">";
    return os;
}